

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double folded_normal_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if (0.0 <= x) {
    dVar2 = cosh(((x * a) / b) / b);
    dVar1 = exp((((x * x + a * a) * -0.5) / b) / b);
    dVar1 = dVar1 * dVar2 * (1.0 / b) * 0.7978845608028654;
  }
  return dVar1;
}

Assistant:

double folded_normal_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_PDF evaluates the Folded Normal PDF.
//
//  Discussion:
//
//    PDF(A;X) = sqrt ( 2 / PI ) * ( 1 / B ) * COSH ( A * X / B^2 )
//      * EXP ( - 0.5 * ( X^2 + A^2 ) / B^2 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = sqrt ( 2.0 / r8_pi ) * ( 1.0 / b ) * cosh ( a * x / b / b )
      * exp ( - 0.5 * ( x * x + a * a ) / b / b );
  }

  return pdf;
}